

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O2

ostream * Eigen::internal::print_matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (ostream *s,Matrix<double,__1,__1,_0,__1,__1> *_m,IOFormat *fmt)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  Index i;
  Index j;
  long lVar6;
  long lVar7;
  long local_210;
  undefined8 local_208;
  string local_1d8 [8];
  long local_1d0;
  stringstream sstr;
  
  lVar7 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar6 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (lVar6 * lVar7 == 0) {
    poVar3 = std::operator<<(s,(string *)fmt);
    std::operator<<(poVar3,(string *)&fmt->matSuffix);
    return s;
  }
  iVar1 = fmt->precision;
  lVar4 = (long)iVar1;
  if (lVar4 == -2) {
    lVar4 = 0x10;
  }
  else {
    bVar2 = true;
    if ((iVar1 == -1) || (iVar1 == 0)) {
      local_208 = 0;
      goto LAB_001047d4;
    }
  }
  local_208 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8);
  *(long *)(s + *(long *)(*(long *)s + -0x18) + 8) = lVar4;
  bVar2 = false;
LAB_001047d4:
  if ((fmt->flags & 1) == 0) {
    local_210 = 0;
    lVar4 = 0;
    for (lVar5 = 0; lVar5 < lVar6; lVar5 = lVar5 + 1) {
      for (lVar6 = 0; lVar6 < lVar7; lVar6 = lVar6 + 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&sstr);
        std::ios::copyfmt((ios *)((stringstream *)&sstr + *(long *)(_sstr + -0x18)));
        std::ostream::_M_insert<double>
                  (*(double *)
                    ((long)(_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_data +
                    lVar6 * 8 +
                    (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                    .m_rows * local_210));
        std::__cxx11::stringbuf::str();
        if (lVar4 <= local_1d0) {
          lVar4 = local_1d0;
        }
        std::__cxx11::string::~string(local_1d8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&sstr);
        lVar7 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
      }
      lVar6 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols;
      local_210 = local_210 + 8;
    }
  }
  else {
    lVar4 = 0;
  }
  std::operator<<(s,(string *)fmt);
  for (lVar6 = 0;
      lVar6 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows; lVar6 = lVar6 + 1) {
    if (lVar6 != 0) {
      std::operator<<(s,(string *)&fmt->rowSpacer);
    }
    std::operator<<(s,(string *)&fmt->rowPrefix);
    if (lVar4 != 0) {
      *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = lVar4;
    }
    std::ostream::_M_insert<double>
              ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data[lVar6]);
    for (lVar7 = 1;
        lVar7 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols; lVar7 = lVar7 + 1) {
      std::operator<<(s,(string *)&fmt->coeffSeparator);
      if (lVar4 != 0) {
        *(long *)(s + *(long *)(*(long *)s + -0x18) + 0x10) = lVar4;
      }
      std::ostream::_M_insert<double>
                ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data[(_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows * lVar7 + lVar6]);
    }
    std::operator<<(s,(string *)&fmt->rowSuffix);
    if (lVar6 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows + -1) {
      std::operator<<(s,(string *)&fmt->rowSeparator);
    }
  }
  std::operator<<(s,(string *)&fmt->matSuffix);
  if (!bVar2) {
    *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_208;
  }
  return s;
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;
  typedef typename Derived::Index Index;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << m.coeff(i,j);
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) s.width(width);
    s << m.coeff(i, 0);
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if (width) s.width(width);
      s << m.coeff(i, j);
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  return s;
}